

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::SelfTestData_Sample::MergeFrom(SelfTestData_Sample *this,SelfTestData_Sample *from)

{
  uint uVar1;
  LogMessage *other;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  string *psVar3;
  InternalMetadata *this_00;
  LogFinisher local_bd;
  uint32 cached_has_bits;
  byte local_a9;
  LogMessage local_a8;
  SelfTestData_Sample *local_70;
  SelfTestData_Sample *from_local;
  SelfTestData_Sample *this_local;
  InternalMetadata *local_58;
  InternalMetadata *local_50;
  undefined8 local_48;
  InternalMetadata *local_40;
  string *local_38;
  InternalMetadata *local_30;
  undefined4 local_24;
  HasBits<1UL> *local_20;
  InternalMetadata *local_18;
  InternalMetadata *local_10;
  
  local_a9 = 0;
  local_70 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0x9dc);
    local_a9 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_a8,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_bd,other);
  }
  if ((local_a9 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  this_local = (SelfTestData_Sample *)&(local_70->super_MessageLite)._internal_metadata_;
  local_58 = this_00;
  local_50 = (InternalMetadata *)this_local;
  local_10 = (InternalMetadata *)this_local;
  if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
    local_48 = 0;
    local_40 = (InternalMetadata *)this_local;
    local_30 = (InternalMetadata *)this_local;
    local_18 = (InternalMetadata *)this_local;
    if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         ((InternalMetadata *)this_local);
      local_38 = &pCVar2->unknown_fields;
    }
    else {
      local_38 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,local_38);
  }
  local_20 = &local_70->_has_bits_;
  local_24 = 0;
  uVar1 = local_20->has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = _internal_input_abi_cxx11_(local_70);
      _internal_set_input(this,psVar3);
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = _internal_expected_abi_cxx11_(local_70);
      _internal_set_expected(this,psVar3);
    }
  }
  return;
}

Assistant:

void SelfTestData_Sample::MergeFrom(const SelfTestData_Sample& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SelfTestData.Sample)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_input(from._internal_input());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_expected(from._internal_expected());
    }
  }
}